

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ec_point_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  uint16_t uVar1;
  bool local_32;
  bool using_ecc;
  uint32_t alg_a;
  uint32_t alg_k;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  uVar1 = ssl_protocol_version(hs->ssl);
  if (uVar1 < 0x304) {
    local_32 = (hs->new_cipher->algorithm_mkey & 2) == 0 &&
               (hs->new_cipher->algorithm_auth & 4) == 0;
    if (local_32) {
      hs_local._7_1_ = true;
    }
    else {
      hs_local._7_1_ = ext_ec_point_add_extension(hs,out);
    }
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ec_point_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  const uint32_t alg_k = hs->new_cipher->algorithm_mkey;
  const uint32_t alg_a = hs->new_cipher->algorithm_auth;
  const bool using_ecc = (alg_k & SSL_kECDHE) || (alg_a & SSL_aECDSA);

  if (!using_ecc) {
    return true;
  }

  return ext_ec_point_add_extension(hs, out);
}